

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

_Bool al_install_system(int version,_func_int__func_void_ptr *atexit_ptr)

{
  _func_void *p_Var1;
  _Bool _Var2;
  uint32_t uVar3;
  ALLEGRO_CONFIG *pAVar4;
  ALLEGRO_PATH *pAVar5;
  char *pcVar6;
  ALLEGRO_SYSTEM *pAVar7;
  time_t tVar8;
  uint uVar9;
  uint uVar10;
  ALLEGRO_SYSTEM bootstrap;
  
  uVar3 = al_get_allegro_version();
  if (active_sysdrv != (ALLEGRO_SYSTEM *)0x0) {
    return true;
  }
  if (((uVar3 ^ version) & 0x7f000000) == 0) {
    uVar9 = uVar3 >> 8 & 0xff;
    uVar10 = (uint)version >> 8 & 0xff;
    if (uVar9 < uVar10) {
      return false;
    }
    if (((uVar3 ^ version) & 0xff0000) != 0) {
      return false;
    }
    if (version < 0 && uVar10 != uVar9) {
      return false;
    }
    _al_tls_init_once();
    _al_reinitialize_tls_values();
    _al_vector_init(&_al_system_interfaces,8);
    bootstrap.displays._unused = 0;
    bootstrap.user_exe_path = (ALLEGRO_PATH *)0x0;
    bootstrap.displays._items = (char *)0x0;
    bootstrap.displays._size = 0;
    bootstrap.mouse_wheel_precision = 0;
    bootstrap.installed = false;
    bootstrap._53_3_ = 0;
    bootstrap.vt = (ALLEGRO_SYSTEM_INTERFACE *)0x0;
    bootstrap.displays._itemsize = 0;
    active_sysdrv = &bootstrap;
    if (sys_config == (ALLEGRO_CONFIG *)0x0) {
      active_sysdrv = &bootstrap;
      sys_config = al_create_config();
    }
    pAVar4 = al_load_config_file("/etc/allegro5rc");
    if (pAVar4 != (ALLEGRO_CONFIG *)0x0) {
      al_merge_config_into(sys_config,pAVar4);
      al_destroy_config(pAVar4);
    }
    pAVar5 = _al_unix_get_path(3);
    if (pAVar5 != (ALLEGRO_PATH *)0x0) {
      al_set_path_filename(pAVar5,"allegro5rc");
      pcVar6 = al_path_cstr(pAVar5,'/');
      pAVar4 = al_load_config_file(pcVar6);
      if (pAVar4 != (ALLEGRO_CONFIG *)0x0) {
        al_merge_config_into(sys_config,pAVar4);
        al_destroy_config(pAVar4);
      }
      al_set_path_filename(pAVar5,".allegro5rc");
      pcVar6 = al_path_cstr(pAVar5,'/');
      pAVar4 = al_load_config_file(pcVar6);
      if (pAVar4 != (ALLEGRO_CONFIG *)0x0) {
        al_merge_config_into(sys_config,pAVar4);
        al_destroy_config(pAVar4);
      }
      al_destroy_path(pAVar5);
    }
    pAVar5 = _al_unix_get_path(6);
    if (pAVar5 != (ALLEGRO_PATH *)0x0) {
      al_set_path_filename(pAVar5,"allegro5.cfg");
      pcVar6 = al_path_cstr(pAVar5,'/');
      pAVar4 = al_load_config_file(pcVar6);
      if (pAVar4 != (ALLEGRO_CONFIG *)0x0) {
        al_merge_config_into(sys_config,pAVar4);
        al_destroy_config(pAVar4);
      }
      al_destroy_path(pAVar5);
    }
    _al_configure_logging();
    _al_register_system_interfaces();
    pAVar7 = find_system(&_user_system_interfaces);
    if ((pAVar7 != (ALLEGRO_SYSTEM *)0x0) ||
       (pAVar7 = find_system(&_al_system_interfaces), pAVar7 != (ALLEGRO_SYSTEM *)0x0)) {
      active_sysdrv = pAVar7;
      pAVar7->mouse_wheel_precision = 1;
      _Var2 = _al_trace_prefix("system",1,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/system.c"
                               ,0x10b,"al_install_system");
      if (_Var2) {
        _al_trace_suffix("Allegro version: %s\n","5.2.7 (GIT)");
      }
      if (_al_app_name[0] == '\0') {
        al_set_app_name((char *)0x0);
      }
      _al_add_exit_func(shutdown_system_driver,"shutdown_system_driver");
      _al_dtor_list = _al_init_destructors();
      _al_init_events();
      _al_init_pixels();
      _al_init_iio_table();
      _al_init_convert_bitmap_list();
      _al_init_timers();
      _al_glsl_init_shaders();
      p_Var1 = active_sysdrv->vt->heartbeat_init;
      if (p_Var1 != (_func_void *)0x0) {
        (*p_Var1)();
      }
      if ((atexit_ptr != (_func_int__func_void_ptr *)0x0) && (atexit_virgin == '\0')) {
        (*atexit_ptr)(al_uninstall_system);
        atexit_virgin = '\x01';
      }
      al_set_errno(0);
      active_sysdrv->installed = true;
      tVar8 = time((time_t *)0x0);
      _al_srand((int)tVar8);
      return true;
    }
    active_sysdrv = (ALLEGRO_SYSTEM *)0x0;
  }
  return false;
}

Assistant:

bool al_install_system(int version, int (*atexit_ptr)(void (*)(void)))
{
   ALLEGRO_SYSTEM bootstrap;
   ALLEGRO_SYSTEM *real_system;
   int library_version = al_get_allegro_version();

   if (active_sysdrv) {
      return true;
   }

   /* Note: We cannot call logging functions yet.
    * TODO: Maybe we want to do the check after the "bootstrap" system
    * is available at least?
    */
   if (!compatible_versions(version, library_version))
      return false;

   _al_tls_init_once();
   _al_reinitialize_tls_values();

   _al_vector_init(&_al_system_interfaces, sizeof(ALLEGRO_SYSTEM_INTERFACE *));

   /* Set up a bootstrap system so the calls expecting it don't freak out */
   memset(&bootstrap, 0, sizeof(bootstrap));
   active_sysdrv = &bootstrap;
   read_allegro_cfg();

#ifdef ALLEGRO_BCC32
   /* This supresses exceptions on floating point divide by zero */
   _control87(MCW_EM, MCW_EM);
#endif

   /* Register builtin system drivers */
   _al_register_system_interfaces();

   /* Check for a user-defined system driver first */
   real_system = find_system(&_user_system_interfaces);

   /* If a user-defined driver is not found, look for a builtin one */
   if (real_system == NULL) {
      real_system = find_system(&_al_system_interfaces);
   }

   if (real_system == NULL) {
      active_sysdrv = NULL;
      return false;
   }
   
   active_sysdrv = real_system;
   active_sysdrv->mouse_wheel_precision = 1;

   ALLEGRO_INFO("Allegro version: %s\n", ALLEGRO_VERSION_STR);

   if (strcmp(al_get_app_name(), "") == 0) {
      al_set_app_name(NULL);
   }

   _al_add_exit_func(shutdown_system_driver, "shutdown_system_driver");

   _al_dtor_list = _al_init_destructors();

   _al_init_events();

   _al_init_pixels();

   _al_init_iio_table();
   
   _al_init_convert_bitmap_list();

   _al_init_timers();

#ifdef ALLEGRO_CFG_SHADER_GLSL
   _al_glsl_init_shaders();
#endif

   if (active_sysdrv->vt->heartbeat_init)
      active_sysdrv->vt->heartbeat_init();

   if (atexit_ptr && atexit_virgin) {
#ifndef ALLEGRO_ANDROID
      atexit_ptr(al_uninstall_system);
#endif
      atexit_virgin = false;
   }

   /* Clear errnos set while searching for config files. */
   al_set_errno(0);

   active_sysdrv->installed = true;

   _al_srand(time(NULL));

   return true;
}